

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

deUint32 __thiscall sglr::GLContext::createProgram(GLContext *this,ShaderProgram *shader)

{
  bool bVar1;
  RenderContext *renderCtx;
  ShaderProgram *this_00;
  ProgramSources *pPVar2;
  TestError *this_01;
  ShaderProgram *local_180;
  undefined1 local_178 [40];
  undefined1 local_150 [40];
  undefined1 local_128 [40];
  ProgramSources local_100;
  
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::reserve
            (&this->m_programs,
             ((long)(this->m_programs).
                    super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_programs).
                    super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  bVar1 = shader->m_hasGeometryShader;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_context;
  local_180 = this_00;
  if (bVar1 == false) {
    glu::makeVtxFragSources(&local_100,&shader->m_vertSrc,&shader->m_fragSrc);
    glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_100);
  }
  else {
    memset(&local_100,0,0xac);
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_100._193_8_ = 0;
    glu::VertexSource::VertexSource((VertexSource *)local_128,&shader->m_vertSrc);
    pPVar2 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_128);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_150,&shader->m_fragSrc);
    pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_150);
    glu::GeometrySource::GeometrySource((GeometrySource *)local_178,&shader->m_geomSrc);
    pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_178);
    glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar2);
    std::__cxx11::string::~string((string *)(local_178 + 8));
    std::__cxx11::string::~string((string *)(local_150 + 8));
    std::__cxx11::string::~string((string *)(local_128 + 8));
  }
  glu::ProgramSources::~ProgramSources(&local_100);
  if ((this_00->m_program).m_info.linkOk != false) {
    if ((this->m_logFlags & 2) != 0) {
      glu::operator<<(this->m_log,this_00);
    }
    std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::push_back
              (&this->m_programs,&local_180);
    return (local_180->m_program).m_program;
  }
  glu::operator<<(this->m_log,this_00);
  glu::ShaderProgram::~ShaderProgram(this_00);
  operator_delete(this_00,0xd0);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrGLContext.cpp"
             ,0x364);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

deUint32 GLContext::createProgram (ShaderProgram* shader)
{
	m_programs.reserve(m_programs.size()+1);

	glu::ShaderProgram* program = DE_NULL;

	if (!shader->m_hasGeometryShader)
		program = new glu::ShaderProgram(m_context, glu::makeVtxFragSources(shader->m_vertSrc, shader->m_fragSrc));
	else
		program = new glu::ShaderProgram(m_context,
										 glu::ProgramSources() << glu::VertexSource(shader->m_vertSrc)
															   << glu::FragmentSource(shader->m_fragSrc)
															   << glu::GeometrySource(shader->m_geomSrc));

	if (!program->isOk())
	{
		m_log << *program;
		delete program;
		TCU_FAIL("Compile failed");
	}

	if ((m_logFlags & GLCONTEXT_LOG_PROGRAMS) != 0)
		m_log << *program;

	m_programs.push_back(program);
	return program->getProgram();
}